

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void paste_objects_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Value_List local_b0;
  Am_Object local_a0;
  Am_Value_List local_98;
  Am_Value_List local_88;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object clipboard;
  Am_Value_List old_selection;
  Am_Value_List copy_clipboard_objs;
  Am_Value_List clipboard_objs;
  Am_Object local_20;
  Am_Object group;
  Am_Object selection_widget;
  Am_Object *cmd_local;
  
  Am_Object::Am_Object(&group);
  Am_Object::Am_Object(&local_20);
  Am_Value_List::Am_Value_List((Am_Value_List *)&copy_clipboard_objs.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&old_selection.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&clipboard);
  Am_Object::Am_Object(&local_68);
  pAVar2 = Am_Object::Get(cmd,0x19d,0);
  Am_Object::operator=(&local_68,pAVar2);
  bVar1 = Am_Object::Valid(&local_68);
  if (!bVar1) {
    Am_Object::operator=(&local_68,&Am_Global_Clipboard);
  }
  Am_Object::Am_Object(&local_78,cmd);
  Am_Get_Selection_Widget_For_Command(&local_70);
  Am_Object::operator=(&group,&local_70);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_78);
  pAVar2 = Am_Object::Get(&group,0x193,0);
  Am_Object::operator=(&local_20,pAVar2);
  pAVar2 = Am_Object::Get(&local_68,0x169,0);
  Am_Value_List::operator=((Am_Value_List *)&copy_clipboard_objs.item,pAVar2);
  Am_Value_List::Am_Value_List(&local_98,(Am_Value_List *)&copy_clipboard_objs.item);
  Am_Copy_Object_List(&local_88,(Am_Object *)&local_98,0x421b48);
  Am_Value_List::operator=((Am_Value_List *)&old_selection.item,&local_88);
  Am_Value_List::~Am_Value_List(&local_88);
  Am_Value_List::~Am_Value_List(&local_98);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
  Am_Object::Set(cmd,0x16d,pAVar3,0);
  Am_Object::Set(cmd,0x16f,false,0);
  Am_Object::Am_Object(&local_a0,&local_20);
  Am_Value_List::Am_Value_List(&local_b0,(Am_Value_List *)&old_selection.item);
  Am_Put_Objects_Into_Group(&local_a0,&local_b0);
  Am_Value_List::~Am_Value_List(&local_b0);
  Am_Object::~Am_Object(&local_a0);
  pAVar2 = Am_Object::Get(&group,0x169,0);
  Am_Value_List::operator=((Am_Value_List *)&clipboard,pAVar2);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&clipboard);
  Am_Object::Set(cmd,0x16c,pAVar3,0);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&old_selection.item);
  Am_Object::Set(cmd,0x169,pAVar3,0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_20);
  Am_Object::Set(cmd,0x171,pAVar3,0);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&old_selection.item);
  Am_Object::Set(&group,0x169,pAVar3,0);
  Am_Object::~Am_Object(&local_68);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&clipboard);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&old_selection.item);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&copy_clipboard_objs.item);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&group);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, paste_objects, (Am_Object cmd))
{
  Am_Object selection_widget, group;
  Am_Value_List clipboard_objs, copy_clipboard_objs, old_selection;
  Am_Object clipboard;
  clipboard = cmd.Get(Am_CLIPBOARD);
  if (!clipboard.Valid())
    clipboard = Am_Global_Clipboard;
  selection_widget = Am_Get_Selection_Widget_For_Command(cmd);
  group = selection_widget.Get(Am_OPERATES_ON);
  clipboard_objs = clipboard.Get(Am_VALUE);
  copy_clipboard_objs = Am_Copy_Object_List(clipboard_objs);
  cmd.Set(Am_OBJECT_MODIFIED, Am_No_Object); //not used
  cmd.Set(Am_HAS_BEEN_UNDONE, false);
  Am_Put_Objects_Into_Group(group, copy_clipboard_objs);
  old_selection = selection_widget.Get(Am_VALUE);
  cmd.Set(Am_OLD_VALUE, old_selection);
  cmd.Set(Am_VALUE, copy_clipboard_objs);
  cmd.Set(Am_SAVED_OLD_OBJECT_OWNER, group);
  selection_widget.Set(Am_VALUE, copy_clipboard_objs);
}